

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O3

int rxa2_fill_memory_blocks(argon2_instance_t *instance)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong unaff_R14;
  ulong uVar6;
  argon2_position_t position;
  ulong local_38;
  
  iVar1 = -0x19;
  if ((instance != (argon2_instance_t *)0x0) && (iVar1 = -0x19, instance->lanes != 0)) {
    if (instance->passes != 0) {
      local_38 = 0;
      uVar2 = (ulong)instance->lanes;
      do {
        uVar4 = 0;
        uVar3 = uVar2;
        do {
          if ((int)uVar2 == 0) {
            uVar2 = 0;
          }
          else {
            uVar5 = 0;
            uVar6 = local_38;
            do {
              unaff_R14 = (uint)unaff_R14 & 0xffffff00 | uVar4;
              position.slice = (char)unaff_R14;
              position._9_3_ = (int3)(unaff_R14 >> 8);
              position.index = (int)(unaff_R14 >> 0x20);
              position.pass = (int)uVar6;
              position.lane = (int)(uVar6 >> 0x20);
              rxa2_fill_segment(instance,position);
              uVar5 = uVar5 + 1;
              uVar2 = (ulong)instance->lanes;
              uVar6 = uVar6 + 0x100000000;
              uVar3 = uVar2;
            } while (uVar5 < uVar2);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 4);
        local_38 = local_38 + 1;
        uVar2 = uVar3;
      } while (local_38 < instance->passes);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int rxa2_fill_memory_blocks(argon2_instance_t *instance) {
	if (instance == NULL || instance->lanes == 0) {
		return ARGON2_INCORRECT_PARAMETER;
	}
	return fill_memory_blocks_st(instance);
}